

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QByteArray * __thiscall QMetaMethodBuilder::returnType(QMetaMethodBuilder *this)

{
  QMetaMethodBuilderPrivate *pQVar1;
  QByteArray *in_RDI;
  QMetaMethodBuilderPrivate *d;
  QByteArray *this_00;
  QMetaMethodBuilder *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  pQVar1 = d_func(in_stack_ffffffffffffffe8);
  if (pQVar1 == (QMetaMethodBuilderPrivate *)0x0) {
    QByteArray::QByteArray((QByteArray *)0x378cd2);
  }
  else {
    QByteArray::QByteArray(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QByteArray QMetaMethodBuilder::returnType() const
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        return d->returnType;
    else
        return QByteArray();
}